

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
xLearn::Loss::Predict
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *pred)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  vector<float,_std::allocator<float>_> *in_RCX;
  long in_RSI;
  long in_RDI;
  size_t end_idx;
  size_t start_idx;
  int i;
  index_t row_len;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd10;
  vector<float,_std::allocator<float>_> **in_stack_fffffffffffffd20;
  Model **in_stack_fffffffffffffd28;
  DMatrix **in_stack_fffffffffffffd30;
  _func_void_DMatrix_ptr_Model_ptr_vector<float,_std::allocator<float>_>_ptr_Score_ptr_bool_unsigned_long_unsigned_long
  *in_stack_fffffffffffffd38;
  ThreadPool *in_stack_fffffffffffffd40;
  bool *in_stack_fffffffffffffd50;
  unsigned_long *in_stack_fffffffffffffd58;
  unsigned_long *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  int line;
  string *in_stack_fffffffffffffd88;
  allocator *paVar5;
  undefined8 in_stack_fffffffffffffd90;
  LogSeverity LVar6;
  _Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_std::vector<float,_std::allocator<float>_>_*,_xLearn::Score_*,_bool,_unsigned_long,_unsigned_long)>
  *in_stack_fffffffffffffdc0;
  ThreadPool *in_stack_fffffffffffffdc8;
  int local_12c;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  Logger local_d8;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  Logger local_24;
  vector<float,_std::allocator<float>_> *local_20;
  long local_10;
  
  line = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  LVar6 = (LogSeverity)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  if (in_RSI == 0) {
    Logger::Logger(&local_24,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Predict",&local_81);
    poVar3 = Logger::Start(LVar6,in_stack_fffffffffffffd88,line,in_stack_fffffffffffffd78);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x36);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"matrix");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)in_stack_fffffffffffffd10);
    abort();
  }
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar2 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd10);
  if (bVar2) {
    Logger::Logger(&local_88,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
               ,&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Predict",&local_d1);
    poVar3 = Logger::Start(LVar6,in_stack_fffffffffffffd88,line,in_stack_fffffffffffffd78);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x37);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"pred.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,true);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    Logger::~Logger((Logger *)in_stack_fffffffffffffd10);
    abort();
  }
  sVar4 = std::vector<float,_std::allocator<float>_>::size(local_20);
  if (sVar4 != *(uint *)(local_10 + 0x10)) {
    Logger::Logger(&local_d8,ERR);
    paVar5 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
               ,paVar5);
    LVar6 = (LogSeverity)((ulong)paVar5 >> 0x20);
    paVar5 = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Predict",paVar5);
    poVar3 = Logger::Start(LVar6,(string *)paVar5,line,in_stack_fffffffffffffd78);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"pred.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar4 = std::vector<float,_std::allocator<float>_>::size(local_20);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"matrix->row_length");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)(local_10 + 0x10));
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    Logger::~Logger((Logger *)in_stack_fffffffffffffd10);
    abort();
  }
  uVar1 = *(uint *)(local_10 + 0x10);
  for (local_12c = 0; (ulong)(long)local_12c < *(ulong *)(in_RDI + 0x20); local_12c = local_12c + 1)
  {
    getStart((ulong)uVar1,*(size_t *)(in_RDI + 0x20),(long)local_12c);
    getEnd((ulong)uVar1,*(size_t *)(in_RDI + 0x20),(long)local_12c);
    std::
    bind<void(&)(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long),xLearn::DMatrix_const*&,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*&,bool&,unsigned_long&,unsigned_long&>
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd20,*(Score ***)(in_RDI + 0x18),in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
    ThreadPool::
    enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,std::vector<float,std::allocator<float>>*,xLearn::Score*,bool,unsigned_long,unsigned_long)>>
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::future<void>::~future((future<void> *)0x1d1256);
  }
  ThreadPool::Sync(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  return;
}

Assistant:

void Loss::Predict(const DMatrix* matrix,
                   Model& model,
                   std::vector<real_t>& pred) {
  CHECK_NOTNULL(matrix);
  CHECK_NE(pred.empty(), true);
  CHECK_EQ(pred.size(), matrix->row_length);
  index_t row_len = matrix->row_length;
  // Predict in multi-thread
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(row_len, threadNumber_, i);
    size_t end_idx = getEnd(row_len, threadNumber_, i);
    pool_->enqueue(std::bind(pred_thread,
                             matrix,
                             &model,
                             &pred,
                             score_func_,
                             norm_,
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
}